

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_fkhash_trie.hpp
# Opt level: O3

void __thiscall
poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::plain_fkhash_trie
          (plain_fkhash_trie<90U,_poplar::hash::vigna_hasher> *this,uint32_t capa_bits,
          uint32_t symb_bits)

{
  pointer puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 in_XMM1 [16];
  undefined1 local_48 [16];
  pointer local_38;
  uint64_t local_30;
  uint64_t uStack_28;
  uint64_t local_20;
  
  uVar4 = 0x10;
  if (0x10 < capa_bits) {
    uVar4 = (ulong)capa_bits;
  }
  (this->table_).width_ = 0;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ids_).size_ = 0;
  (this->ids_).mask_ = 0;
  (this->ids_).width_ = 0;
  this->size_ = 0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_).size_ = 0;
  (this->table_).mask_ = 0;
  (this->table_).width_ = 0;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = -1L << (uVar4 & 0x3f);
  (this->capa_size_).bits_ = (uint32_t)uVar4;
  (this->capa_size_).mask_ = ~uVar6;
  (this->symb_size_).bits_ = symb_bits;
  (this->symb_size_).mask_ = ~(-1L << ((ulong)symb_bits & 0x3f));
  auVar3 = vcvtusi2sd_avx512f(in_XMM1,uVar6 * -0x5a);
  auVar7._0_8_ = auVar3._0_8_ / 100.0;
  auVar7._8_8_ = auVar3._8_8_;
  uVar5 = vcvttsd2usi_avx512f(auVar7);
  this->max_size_ = uVar5;
  compact_vector::compact_vector((compact_vector *)local_48,-uVar6,symb_bits + (uint32_t)uVar4);
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48 = ZEXT816(0) << 0x20;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_38 = (pointer)0x0;
  if (puVar1 == (pointer)0x0) {
    (this->table_).width_ = local_20;
    (this->table_).size_ = local_30;
    (this->table_).mask_ = uStack_28;
  }
  else {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    (this->table_).width_ = local_20;
    (this->table_).size_ = local_30;
    (this->table_).mask_ = uStack_28;
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
    }
  }
  compact_vector::compact_vector
            ((compact_vector *)local_48,(this->capa_size_).mask_ + 1,(this->capa_size_).bits_);
  puVar1 = (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48 = ZEXT816(0) << 0x20;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_38 = (pointer)0x0;
  if (puVar1 == (pointer)0x0) {
    (this->ids_).width_ = local_20;
    (this->ids_).size_ = local_30;
    (this->ids_).mask_ = uStack_28;
  }
  else {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    (this->ids_).width_ = local_20;
    (this->ids_).size_ = local_30;
    (this->ids_).mask_ = uStack_28;
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
    }
  }
  return;
}

Assistant:

plain_fkhash_trie(uint32_t capa_bits, uint32_t symb_bits) {
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};
        symb_size_ = size_p2{symb_bits};
        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);
        table_ = compact_vector{capa_size_.size(), capa_size_.bits() + symb_size_.bits()};
        ids_ = compact_vector{capa_size_.size(), capa_size_.bits()};
    }